

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_tls12_prf_set_key
          (psa_tls12_prf_key_derivation_t *prf,psa_algorithm_t hash_alg,uint8_t *data,
          size_t data_length)

{
  psa_status_t status;
  size_t data_length_local;
  uint8_t *data_local;
  psa_algorithm_t hash_alg_local;
  psa_tls12_prf_key_derivation_t *prf_local;
  
  if (prf->state == TLS12_PRF_STATE_SEED_SET) {
    prf_local._4_4_ = psa_hmac_setup_internal(&prf->hmac,data,data_length,hash_alg);
    if (prf_local._4_4_ == 0) {
      prf->state = TLS12_PRF_STATE_KEY_SET;
      prf_local._4_4_ = 0;
    }
  }
  else {
    prf_local._4_4_ = -0x89;
  }
  return prf_local._4_4_;
}

Assistant:

static psa_status_t psa_tls12_prf_set_key( psa_tls12_prf_key_derivation_t *prf,
                                           psa_algorithm_t hash_alg,
                                           const uint8_t *data,
                                           size_t data_length )
{
    psa_status_t status;
    if( prf->state != TLS12_PRF_STATE_SEED_SET )
        return( PSA_ERROR_BAD_STATE );

    status = psa_hmac_setup_internal( &prf->hmac, data, data_length, hash_alg );
    if( status != PSA_SUCCESS )
        return( status );

    prf->state = TLS12_PRF_STATE_KEY_SET;

    return( PSA_SUCCESS );
}